

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cc
# Opt level: O0

string * __thiscall
wabt::Decompiler::Decompile_abi_cxx11_(string *__return_storage_ptr__,Decompiler *this)

{
  Func *f_00;
  Enum EVar1;
  Table *args;
  Global *args_00;
  bool bVar2;
  Index IVar3;
  Enum EVar4;
  vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_> *this_00;
  reference ppMVar5;
  vector<wabt::Global_*,_std::allocator<wabt::Global_*>_> *this_01;
  reference ppGVar6;
  vector<wabt::Table_*,_std::allocator<wabt::Table_*>_> *this_02;
  reference ppTVar7;
  vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_> *this_03;
  reference ppDVar8;
  string *args_01;
  ulong uVar9;
  vector<wabt::Func_*,_std::allocator<wabt::Func_*>_> *this_04;
  reference ppFVar10;
  reference pvVar11;
  Type t_00;
  char *pcVar12;
  reference pbVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  char **ppcVar14;
  Index index;
  char (*args_2) [2];
  string_view sVar15;
  char (*in_stack_fffffffffffffa88) [4];
  size_t amount;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *stat;
  iterator __end4;
  iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  undefined1 local_4d8 [8];
  Value val;
  uint local_4ac;
  Index i_1;
  char *local_4a0;
  string local_498;
  Type local_478;
  string local_470;
  string local_450;
  undefined1 local_430 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  Type t;
  Index i;
  undefined1 local_3e0 [8];
  AST ast;
  bool is_import_3;
  Func *f;
  const_iterator __end2_4;
  const_iterator __begin2_4;
  vector<wabt::Func_*,_std::allocator<wabt::Func_*>_> *__range2_4;
  undefined1 local_2d8 [4];
  Index func_index;
  string ds;
  string local_298;
  DataSegment *local_278;
  DataSegment *dat;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_> *__range2_3;
  string local_238;
  string local_218;
  Type local_1f8;
  char *local_1f0;
  string local_1e8;
  string_view local_1c8;
  byte local_1b1;
  Table *pTStack_1b0;
  bool is_import_2;
  Table *tab;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<wabt::Table_*,_std::allocator<wabt::Table_*>_> *__range2_2;
  undefined1 local_188 [4];
  Index table_index;
  string local_168;
  Type local_148;
  char *local_140;
  string local_138;
  string_view local_118;
  byte local_101;
  Global *pGStack_100;
  bool is_import_1;
  Global *g;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<wabt::Global_*,_std::allocator<wabt::Global_*>_> *__range2_1;
  undefined1 local_d8 [4];
  Index global_index;
  string local_b8;
  string local_98;
  string local_78;
  string_view local_58;
  byte local_41;
  Memory *pMStack_40;
  bool is_import;
  Memory *m;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_> *__range2;
  Index memory_index;
  Decompiler *this_local;
  string *s;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __range2._0_4_ = 0;
  this_00 = &((this->mc).module)->memories;
  __end2 = std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>::begin(this_00);
  m = (Memory *)std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>::end(this_00);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<wabt::Memory_*const_*,_std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>_>
                                *)&m);
    if (!bVar2) break;
    ppMVar5 = __gnu_cxx::
              __normal_iterator<wabt::Memory_*const_*,_std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>_>
              ::operator*(&__end2);
    pMStack_40 = *ppMVar5;
    sVar15 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)pMStack_40);
    args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (ulong)(uint)__range2;
    local_58 = sVar15;
    local_41 = CheckImportExport(this,__return_storage_ptr__,Memory,(uint)__range2,sVar15);
    cat<char[8],std::__cxx11::string>(&local_78,(wabt *)"memory ",(char (*) [8])pMStack_40,args_1);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    if ((local_41 & 1) == 0) {
      std::__cxx11::to_string(&local_b8,(pMStack_40->page_limits).initial);
      std::__cxx11::to_string((string *)local_d8,(pMStack_40->page_limits).max);
      cat<char[11],std::__cxx11::string,char[8],std::__cxx11::string,char[2]>
                (&local_98,(wabt *)"(initial: ",(char (*) [11])&local_b8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)", max: ",
                 (char (*) [8])local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x35778e,
                 (char (*) [2])in_stack_fffffffffffffa88);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)local_d8);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,";\n");
    __range2._0_4_ = (uint)__range2 + 1;
    __gnu_cxx::
    __normal_iterator<wabt::Memory_*const_*,_std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>_>
    ::operator++(&__end2);
  }
  bVar2 = std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>::empty
                    (&((this->mc).module)->memories);
  if (!bVar2) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
  }
  __range2_1._4_4_ = 0;
  this_01 = &((this->mc).module)->globals;
  __end2_1 = std::vector<wabt::Global_*,_std::allocator<wabt::Global_*>_>::begin(this_01);
  g = (Global *)std::vector<wabt::Global_*,_std::allocator<wabt::Global_*>_>::end(this_01);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<wabt::Global_*const_*,_std::vector<wabt::Global_*,_std::allocator<wabt::Global_*>_>_>
                        *)&g);
    if (!bVar2) break;
    ppGVar6 = __gnu_cxx::
              __normal_iterator<wabt::Global_*const_*,_std::vector<wabt::Global_*,_std::allocator<wabt::Global_*>_>_>
              ::operator*(&__end2_1);
    pGStack_100 = *ppGVar6;
    sVar15 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)pGStack_100);
    ppcVar14 = (char **)sVar15._M_str;
    local_118 = sVar15;
    local_101 = CheckImportExport(this,__return_storage_ptr__,Global,__range2_1._4_4_,sVar15);
    args_00 = pGStack_100;
    local_148 = pGStack_100->type;
    local_140 = GetDecompTypeName(local_148);
    pcVar12 = ":";
    cat<char[8],std::__cxx11::string,char[2],char_const*>
              (&local_138,(wabt *)"global ",(char (*) [8])args_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)":",
               (char (*) [2])&local_140,ppcVar14);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_138);
    std::__cxx11::string::~string((string *)&local_138);
    if ((local_101 & 1) == 0) {
      InitExp_abi_cxx11_((string *)local_188,this,&pGStack_100->init_expr);
      cat<char[4],std::__cxx11::string>
                (&local_168,(wabt *)0x361f7f,(char (*) [4])local_188,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar12);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_168);
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)local_188);
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,";\n");
    __range2_1._4_4_ = __range2_1._4_4_ + 1;
    __gnu_cxx::
    __normal_iterator<wabt::Global_*const_*,_std::vector<wabt::Global_*,_std::allocator<wabt::Global_*>_>_>
    ::operator++(&__end2_1);
  }
  bVar2 = std::vector<wabt::Global_*,_std::allocator<wabt::Global_*>_>::empty
                    (&((this->mc).module)->globals);
  if (!bVar2) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
  }
  __range2_2._4_4_ = 0;
  this_02 = &((this->mc).module)->tables;
  __end2_2 = std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>::begin(this_02);
  tab = (Table *)std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>::end(this_02);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2_2,
                       (__normal_iterator<wabt::Table_*const_*,_std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>_>
                        *)&tab);
    if (!bVar2) break;
    ppTVar7 = __gnu_cxx::
              __normal_iterator<wabt::Table_*const_*,_std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>_>
              ::operator*(&__end2_2);
    pTStack_1b0 = *ppTVar7;
    sVar15 = (string_view)
             std::__cxx11::string::operator_cast_to_basic_string_view((string *)pTStack_1b0);
    ppcVar14 = (char **)sVar15._M_str;
    local_1c8 = sVar15;
    local_1b1 = CheckImportExport(this,__return_storage_ptr__,Table,__range2_2._4_4_,sVar15);
    args = pTStack_1b0;
    local_1f8 = pTStack_1b0->elem_type;
    local_1f0 = GetDecompTypeName(local_1f8);
    cat<char[7],std::__cxx11::string,char[2],char_const*>
              (&local_1e8,(wabt *)"table ",(char (*) [7])args,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)":",
               (char (*) [2])&local_1f0,ppcVar14);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    if ((local_1b1 & 1) == 0) {
      std::__cxx11::to_string(&local_238,(pTStack_1b0->elem_limits).initial);
      std::__cxx11::to_string((string *)&__range2_3,(pTStack_1b0->elem_limits).max);
      cat<char[7],std::__cxx11::string,char[8],std::__cxx11::string,char[2]>
                (&local_218,(wabt *)"(min: ",(char (*) [7])&local_238,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)", max: ",
                 (char (*) [8])&__range2_3,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x35778e,
                 (char (*) [2])in_stack_fffffffffffffa88);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_218);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&__range2_3);
      std::__cxx11::string::~string((string *)&local_238);
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,";\n");
    __range2_2._4_4_ = __range2_2._4_4_ + 1;
    __gnu_cxx::
    __normal_iterator<wabt::Table_*const_*,_std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>_>
    ::operator++(&__end2_2);
  }
  bVar2 = std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>::empty
                    (&((this->mc).module)->tables);
  if (!bVar2) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
  }
  this_03 = &((this->mc).module)->data_segments;
  __end2_3 = std::vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>::begin(this_03);
  dat = (DataSegment *)
        std::vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>::end(this_03);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2_3,
                       (__normal_iterator<wabt::DataSegment_*const_*,_std::vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>_>
                        *)&dat);
    if (!bVar2) break;
    ppDVar8 = __gnu_cxx::
              __normal_iterator<wabt::DataSegment_*const_*,_std::vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>_>
              ::operator*(&__end2_3);
    local_278 = *ppDVar8;
    args_01 = &local_278->name;
    InitExp_abi_cxx11_((string *)((long)&ds.field_2 + 8),this,&local_278->offset);
    cat<char[6],std::__cxx11::string,char[10],std::__cxx11::string,char[4]>
              (&local_298,(wabt *)"data ",(char (*) [6])args_01,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"(offset: ",
               (char (*) [10])((long)&ds.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)") =",
               in_stack_fffffffffffffa88);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_298);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)(ds.field_2._M_local_buf + 8));
    BinaryToString_abi_cxx11_((string *)local_2d8,this,&local_278->data);
    uVar9 = std::__cxx11::string::size();
    if (this->target_exp_width >> 1 < uVar9) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
    }
    else {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__," ");
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)local_2d8);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,";\n");
    std::__cxx11::string::~string((string *)local_2d8);
    __gnu_cxx::
    __normal_iterator<wabt::DataSegment_*const_*,_std::vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>_>
    ::operator++(&__end2_3);
  }
  bVar2 = std::vector<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>::empty
                    (&((this->mc).module)->data_segments);
  if (!bVar2) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
  }
  __range2_4._4_4_ = 0;
  this_04 = &((this->mc).module)->funcs;
  __end2_4 = std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::begin(this_04);
  f = (Func *)std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>::end(this_04);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&__end2_4,
                       (__normal_iterator<wabt::Func_*const_*,_std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>_>
                        *)&f);
    if (!bVar2) break;
    ppFVar10 = __gnu_cxx::
               __normal_iterator<wabt::Func_*const_*,_std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>_>
               ::operator*(&__end2_4);
    f_00 = *ppFVar10;
    this->cur_func = f_00;
    sVar15 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)f_00);
    args_2 = (char (*) [2])sVar15._M_len;
    ast.blocks_closed.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)args_2;
    bVar2 = CheckImportExport(this,__return_storage_ptr__,First,__range2_4._4_4_,sVar15);
    AST::AST((AST *)local_3e0,&this->mc,f_00);
    this->cur_ast = (AST *)local_3e0;
    if (!bVar2) {
      IVar3 = Func::GetNumResults(f_00);
      args_2 = (char (*) [2])0x1;
      AST::Construct((AST *)local_3e0,&f_00->exprs,IVar3,0,true);
      pvVar11 = std::vector<wabt::Node,_std::allocator<wabt::Node>_>::operator[]
                          ((vector<wabt::Node,_std::allocator<wabt::Node>_> *)&ast,0);
      LoadStoreTracking::Track(&this->lst,pvVar11);
      LoadStoreTracking::CheckLayouts(&this->lst);
    }
    cat<char[10],std::__cxx11::string,char[2]>
              ((string *)&t.type_index_,(wabt *)"function ",(char (*) [10])f_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x36256a,args_2)
    ;
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&t.type_index_);
    std::__cxx11::string::~string((string *)&t.type_index_);
    t.enum_ = Any;
    while( true ) {
      EVar1 = t.enum_;
      EVar4 = Func::GetNumParams(f_00);
      ppcVar14 = (char **)(ulong)(uint)EVar4;
      if ((uint)EVar4 <= (uint)EVar1) break;
      if (t.enum_ != Any) {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
      }
      register0x00000000 = Func::GetParamType(f_00,t.enum_);
      IndexToAlphaName_abi_cxx11_(&local_450,(wabt *)(ulong)(uint)t.enum_,index);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_430,
                     "$",&local_450);
      std::__cxx11::string::~string((string *)&local_450);
      local_478 = stack0xfffffffffffffbf4;
      LocalDecl(&local_470,this,(string *)local_430,stack0xfffffffffffffbf4);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_470);
      std::__cxx11::string::~string((string *)&local_470);
      std::__cxx11::string::~string((string *)local_430);
      t.enum_ = t.enum_ + ~I64;
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
    IVar3 = Func::GetNumResults(f_00);
    if (IVar3 != 0) {
      IVar3 = Func::GetNumResults(f_00);
      if (IVar3 == 1) {
        t_00 = Func::GetResultType(f_00,0);
        local_4a0 = GetDecompTypeName(t_00);
        cat<char[2],char_const*>(&local_498,(wabt *)":",(char (*) [2])&local_4a0,ppcVar14);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_498);
        std::__cxx11::string::~string((string *)&local_498);
      }
      else {
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,":(");
        local_4ac = 0;
        while( true ) {
          IVar3 = Func::GetNumResults(f_00);
          if (IVar3 <= local_4ac) break;
          if (local_4ac != 0) {
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,", ");
          }
          register0x00000000 = Func::GetResultType(f_00,local_4ac);
          pcVar12 = GetDecompTypeName(register0x00000000);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,pcVar12);
          local_4ac = local_4ac + 1;
        }
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,")");
      }
    }
    if (bVar2) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,";");
    }
    else {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__," {\n");
      pvVar11 = std::vector<wabt::Node,_std::allocator<wabt::Node>_>::operator[]
                          ((vector<wabt::Node,_std::allocator<wabt::Node>_> *)&ast,0);
      DecompileExpr((Value *)local_4d8,this,pvVar11,(Node *)0x0);
      amount = this->indent_amount;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&__range4);
      IndentValue(this,(Value *)local_4d8,amount,___range4);
      __end4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_4d8);
      stat = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_4d8);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (&__end4,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    *)&stat);
        if (!bVar2) break;
        pbVar13 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end4);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)pbVar13);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end4);
      }
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"}");
      Value::~Value((Value *)local_4d8);
    }
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n\n");
    ModuleContext::EndFunc(&this->mc);
    LoadStoreTracking::Clear(&this->lst);
    __range2_4._4_4_ = __range2_4._4_4_ + 1;
    this->cur_ast = (AST *)0x0;
    this->cur_func = (Func *)0x0;
    AST::~AST((AST *)local_3e0);
    __gnu_cxx::
    __normal_iterator<wabt::Func_*const_*,_std::vector<wabt::Func_*,_std::allocator<wabt::Func_*>_>_>
    ::operator++(&__end2_4);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Decompile() {
    std::string s;
    // Memories.
    Index memory_index = 0;
    for (auto m : mc.module.memories) {
      auto is_import =
          CheckImportExport(s, ExternalKind::Memory, memory_index, m->name);
      s += cat("memory ", m->name);
      if (!is_import) {
        s += cat("(initial: ", std::to_string(m->page_limits.initial),
                 ", max: ", std::to_string(m->page_limits.max), ")");
      }
      s += ";\n";
      memory_index++;
    }
    if (!mc.module.memories.empty())
      s += "\n";

    // Globals.
    Index global_index = 0;
    for (auto g : mc.module.globals) {
      auto is_import =
          CheckImportExport(s, ExternalKind::Global, global_index, g->name);
      s += cat("global ", g->name, ":", GetDecompTypeName(g->type));
      if (!is_import) {
        s += cat(" = ", InitExp(g->init_expr));
      }
      s += ";\n";
      global_index++;
    }
    if (!mc.module.globals.empty())
      s += "\n";

    // Tables.
    Index table_index = 0;
    for (auto tab : mc.module.tables) {
      auto is_import =
          CheckImportExport(s, ExternalKind::Table, table_index, tab->name);
      s += cat("table ", tab->name, ":", GetDecompTypeName(tab->elem_type));
      if (!is_import) {
        s += cat("(min: ", std::to_string(tab->elem_limits.initial),
                 ", max: ", std::to_string(tab->elem_limits.max), ")");
      }
      s += ";\n";
      table_index++;
    }
    if (!mc.module.tables.empty())
      s += "\n";

    // Data.
    for (auto dat : mc.module.data_segments) {
      s += cat("data ", dat->name, "(offset: ", InitExp(dat->offset), ") =");
      auto ds = BinaryToString(dat->data);
      if (ds.size() > target_exp_width / 2) {
        s += "\n";
      } else {
        s += " ";
      }
      s += ds;
      s += ";\n";
    }
    if (!mc.module.data_segments.empty())
      s += "\n";

    // Code.
    Index func_index = 0;
    for (auto f : mc.module.funcs) {
      cur_func = f;
      auto is_import =
          CheckImportExport(s, ExternalKind::Func, func_index, f->name);
      AST ast(mc, f);
      cur_ast = &ast;
      if (!is_import) {
        ast.Construct(f->exprs, f->GetNumResults(), 0, true);
        lst.Track(ast.exp_stack[0]);
        lst.CheckLayouts();
      }
      s += cat("function ", f->name, "(");
      for (Index i = 0; i < f->GetNumParams(); i++) {
        if (i)
          s += ", ";
        auto t = f->GetParamType(i);
        auto name = "$" + IndexToAlphaName(i);
        s += LocalDecl(name, t);
      }
      s += ")";
      if (f->GetNumResults()) {
        if (f->GetNumResults() == 1) {
          s += cat(":", GetDecompTypeName(f->GetResultType(0)));
        } else {
          s += ":(";
          for (Index i = 0; i < f->GetNumResults(); i++) {
            if (i)
              s += ", ";
            s += GetDecompTypeName(f->GetResultType(i));
          }
          s += ")";
        }
      }
      if (is_import) {
        s += ";";
      } else {
        s += " {\n";
        auto val = DecompileExpr(ast.exp_stack[0], nullptr);
        IndentValue(val, indent_amount, {});
        for (auto& stat : val.v) {
          s += stat;
          s += "\n";
        }
        s += "}";
      }
      s += "\n\n";
      mc.EndFunc();
      lst.Clear();
      func_index++;
      cur_ast = nullptr;
      cur_func = nullptr;
    }
    return s;
  }